

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O1

void __thiscall EthBasePort::ProcessExtraData(EthBasePort *this,uchar *packet)

{
  byte bVar1;
  byte bVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  ushort uVar3;
  
  (this->FpgaStatus).FwBusReset = (bool)(*packet & 1);
  (this->FpgaStatus).FwPacketDropped = (bool)(*packet >> 1 & 1);
  (this->FpgaStatus).EthInternalError = (bool)(*packet >> 2 & 1);
  (this->FpgaStatus).EthSummaryError = (bool)(*packet >> 3 & 1);
  bVar1 = *packet;
  (this->FpgaStatus).noForwardFlag = (bool)(bVar1 >> 4 & 1);
  (this->FpgaStatus).srcPort = *packet >> 5 & 3;
  (this->FpgaStatus).numStateInvalid = (uint)packet[2];
  (this->FpgaStatus).numPacketError = (uint)packet[3];
  bVar2 = packet[1];
  this->FPGA_RecvTime =
       (double)(ushort)(*(ushort *)(packet + 4) << 8 | *(ushort *)(packet + 4) >> 8) / 49152000.0;
  uVar3 = *(ushort *)(packet + 6) << 8 | *(ushort *)(packet + 6) >> 8;
  this->FPGA_TotalTime = (double)uVar3 / 49152000.0;
  (this->super_BasePort).newFwBusGeneration = (uint)bVar2;
  if (((this->super_BasePort).FwBusGeneration != (uint)bVar2) && ((bVar1 >> 4 & 1) == 0)) {
    UNRECOVERED_JUMPTABLE = (this->super_BasePort)._vptr_BasePort[0x30];
    (*UNRECOVERED_JUMPTABLE)(this,(ulong)bVar2,(ulong)uVar3,UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void EthBasePort::ProcessExtraData(const unsigned char *packet)
{
    FpgaStatus.FwBusReset = (packet[0]&FwBusReset);
    FpgaStatus.FwPacketDropped = (packet[0]&FwPacketDropped);
    FpgaStatus.EthInternalError = (packet[0]&EthInternalError);
    FpgaStatus.EthSummaryError = (packet[0]&EthSummaryError);
    FpgaStatus.noForwardFlag = (packet[0]&noForwardFlag);
    FpgaStatus.srcPort = (packet[0]&srcPortMask)>>srcPortShift;
    FpgaStatus.numStateInvalid = packet[2];
    FpgaStatus.numPacketError = packet[3];
    unsigned int FwBusGeneration_FPGA = packet[1];

    const double FPGA_sysclk_MHz = 49.152;      /* FPGA sysclk in MHz (from AmpIO.cpp) */
    const unsigned short *packetW = reinterpret_cast<const unsigned short *>(packet);
    FPGA_RecvTime = bswap_16(packetW[2])/(FPGA_sysclk_MHz*1.0e6);
    FPGA_TotalTime = bswap_16(packetW[3])/(FPGA_sysclk_MHz*1.0e6);

    newFwBusGeneration = FwBusGeneration_FPGA;
    if ((FwBusGeneration_FPGA != FwBusGeneration) && !FpgaStatus.noForwardFlag)
        OnFwBusReset(FwBusGeneration_FPGA);
}